

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

base_uint<256UL,_void> * __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STBitString<256ul>,jbcoin::base_uint<256ul,void>>
          (base_uint<256UL,_void> *__return_storage_ptr__,STObject *this,SField *field)

{
  int iVar1;
  STBase *pSVar2;
  value_type *pvVar3;
  STBitString<256UL> *local_50;
  STBitString<256UL> *cf;
  SerializedTypeID id;
  STBase *rf;
  SField *field_local;
  STObject *this_local;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])();
  if (iVar1 == 0) {
    base_uint<256UL,_void>::base_uint(__return_storage_ptr__);
  }
  else {
    if (pSVar2 == (STBase *)0x0) {
      local_50 = (STBitString<256UL> *)0x0;
    }
    else {
      local_50 = (STBitString<256UL> *)
                 __dynamic_cast(pSVar2,&STBase::typeinfo,&STBitString<256ul>::typeinfo,0);
    }
    if (local_50 == (STBitString<256UL> *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    pvVar3 = STBitString<256UL>::value(local_50);
    *(undefined8 *)__return_storage_ptr__->pn = *(undefined8 *)pvVar3->pn;
    *(undefined8 *)(__return_storage_ptr__->pn + 2) = *(undefined8 *)(pvVar3->pn + 2);
    *(undefined8 *)(__return_storage_ptr__->pn + 4) = *(undefined8 *)(pvVar3->pn + 4);
    *(undefined8 *)(__return_storage_ptr__->pn + 6) = *(undefined8 *)(pvVar3->pn + 6);
  }
  return __return_storage_ptr__;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }